

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_node_impl.h
# Opt level: O0

int __thiscall
node::BinaryNode<label::StringLabel>::get_tree_size(BinaryNode<label::StringLabel> *this)

{
  bool bVar1;
  int iVar2;
  pointer pBVar3;
  int local_14;
  int size;
  BinaryNode<label::StringLabel> *this_local;
  
  local_14 = 1;
  bVar1 = std::operator!=(&this->left_child_,(nullptr_t)0x0);
  if (bVar1) {
    pBVar3 = std::
             unique_ptr<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
             ::operator->(&this->left_child_);
    local_14 = get_tree_size(pBVar3);
    local_14 = local_14 + 1;
  }
  bVar1 = std::operator!=(&this->right_child_,(nullptr_t)0x0);
  if (bVar1) {
    pBVar3 = std::
             unique_ptr<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
             ::operator->(&this->right_child_);
    iVar2 = get_tree_size(pBVar3);
    local_14 = iVar2 + local_14;
  }
  return local_14;
}

Assistant:

int BinaryNode<Label>::get_tree_size() const {
  int size = 1;

  if(left_child_ != nullptr)
    size += left_child_->get_tree_size();
  if(right_child_ != nullptr)
    size += right_child_->get_tree_size();

  return size;
}